

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

ALCenum __thiscall
anon_unknown.dwarf_211787::AlsaCapture::captureSamples
          (AlsaCapture *this,byte *buffer,ALCuint samples)

{
  const_iterator __last;
  bool bVar1;
  int iVar2;
  pointer this_00;
  size_type sVar3;
  undefined8 uVar4;
  size_t in_RCX;
  uint in_EDX;
  long in_RSI;
  const_iterator in_RDI;
  char *err;
  snd_pcm_sframes_t amt;
  vector<al::byte,_al::allocator<al::byte,_1UL>_> *in_stack_ffffffffffffff58;
  FILE *in_stack_ffffffffffffff60;
  __normal_iterator<al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>
  *in_stack_ffffffffffffff68;
  vector<al::byte,_al::allocator<al::byte,_1UL>_> *in_stack_ffffffffffffff70;
  vector<al::byte,_al::allocator<al::byte,_1UL>_> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 uVar5;
  ulong local_28;
  uint local_1c;
  long local_18;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x2342c4);
  if (bVar1) {
    this_00 = std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                        ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x2342d8);
    RingBuffer::read(this_00,(int)in_RSI,(void *)(ulong)in_EDX,in_RCX);
  }
  else {
    *(ulong *)(in_RDI._M_current + 0x40) = *(undefined8 *)(in_RDI._M_current + 0x40) - (ulong)in_EDX
    ;
    local_1c = in_EDX;
    local_18 = in_RSI;
    do {
      do {
        while( true ) {
          bVar1 = std::atomic<bool>::load
                            ((atomic<bool> *)in_stack_ffffffffffffff68,
                             (memory_order)((ulong)in_stack_ffffffffffffff60 >> 0x20));
          uVar5 = bVar1 && local_1c != 0;
          if (!bVar1 || local_1c == 0) goto LAB_002346b5;
          local_28 = 0;
          bVar1 = std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::empty
                            (in_stack_ffffffffffffff70);
          if (bVar1) {
            if ((in_RDI._M_current[0x30] & 1) != 0) {
              local_28 = (*(anonymous_namespace)::psnd_pcm_readi)
                                   (*(undefined8 *)(in_RDI._M_current + 0x10),local_18,local_1c);
            }
          }
          else {
            in_stack_ffffffffffffff70 =
                 *(vector<al::byte,_al::allocator<al::byte,_1UL>_> **)(in_RDI._M_current + 0x10);
            in_stack_ffffffffffffff78 = (anonymous_namespace)::psnd_pcm_bytes_to_frames;
            sVar3 = std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::size
                              ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)
                               (in_RDI._M_current + 0x18));
            local_28 = (*(code *)in_stack_ffffffffffffff78)(in_stack_ffffffffffffff70,sVar3);
            if (local_1c < local_28) {
              local_28 = (ulong)local_1c;
            }
            uVar4 = (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)
                              (*(undefined8 *)(in_RDI._M_current + 0x10),local_28);
            std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::begin(in_stack_ffffffffffffff58);
            std::
            copy_n<__gnu_cxx::__normal_iterator<al::byte*,std::vector<al::byte,al::allocator<al::byte,1ul>>>,long,al::byte*>
                      ((__normal_iterator<al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>
                        )in_RDI._M_current,CONCAT17(uVar5,in_stack_ffffffffffffff80),
                       (byte *)in_stack_ffffffffffffff78);
            in_stack_ffffffffffffff68 =
                 (__normal_iterator<al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>
                  *)(in_RDI._M_current + 0x18);
            std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::begin(in_stack_ffffffffffffff58);
            __gnu_cxx::
            __normal_iterator<al::byte_const*,std::vector<al::byte,al::allocator<al::byte,1ul>>>::
            __normal_iterator<al::byte*>
                      ((__normal_iterator<const_al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>
                        *)in_stack_ffffffffffffff58);
            std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::begin(in_stack_ffffffffffffff58);
            __gnu_cxx::
            __normal_iterator<al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>::
            operator+(in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
            __gnu_cxx::
            __normal_iterator<al::byte_const*,std::vector<al::byte,al::allocator<al::byte,1ul>>>::
            __normal_iterator<al::byte*>
                      ((__normal_iterator<const_al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<al::byte_*,_std::vector<al::byte,_al::allocator<al::byte,_1UL>_>_>
                        *)in_stack_ffffffffffffff58);
            __last._M_current._7_1_ = uVar5;
            __last._M_current._0_7_ = in_stack_ffffffffffffff80;
            std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::erase
                      (in_stack_ffffffffffffff78,in_RDI,__last);
            local_28 = (*(code *)(anonymous_namespace)::psnd_pcm_bytes_to_frames)
                                 (*(undefined8 *)(in_RDI._M_current + 0x10),uVar4);
          }
          if ((long)local_28 < 0) break;
          local_18 = local_18 + local_28;
          local_1c = local_1c - (int)local_28;
        }
        if (0 < (int)gLogLevel) {
          in_stack_ffffffffffffff60 = (FILE *)gLogFile;
          uVar4 = (*(anonymous_namespace)::psnd_strerror)(local_28 & 0xffffffff);
          fprintf(in_stack_ffffffffffffff60,"[ALSOFT] (EE) read error: %s\n",uVar4);
        }
      } while (local_28 == 0xfffffffffffffff5);
      iVar2 = (*(anonymous_namespace)::psnd_pcm_recover)
                        (*(undefined8 *)(in_RDI._M_current + 0x10),local_28 & 0xffffffff,1);
      local_28 = (ulong)iVar2;
      if (-1 < (long)local_28) {
        iVar2 = (*(anonymous_namespace)::psnd_pcm_start)(*(undefined8 *)(in_RDI._M_current + 0x10));
        local_28 = (ulong)iVar2;
        if (-1 < (long)local_28) {
          local_28 = (*(anonymous_namespace)::psnd_pcm_avail_update)
                               (*(undefined8 *)(in_RDI._M_current + 0x10));
        }
      }
      if ((long)local_28 < 0) {
        uVar4 = (*(anonymous_namespace)::psnd_strerror)(local_28 & 0xffffffff);
        if (0 < (int)gLogLevel) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (EE) restore error: %s\n",uVar4);
        }
        ALCdevice::handleDisconnect
                  (*(ALCdevice **)(in_RDI._M_current + 8),"Capture recovery failure: %s",uVar4);
        break;
      }
    } while (local_1c <= local_28);
LAB_002346b5:
    if (local_1c != 0) {
      (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)
                (*(undefined8 *)(in_RDI._M_current + 0x10),local_1c);
      std::fill_n<al::byte*,long,al::byte>
                ((byte *)CONCAT17(uVar5,in_stack_ffffffffffffff80),(long)in_stack_ffffffffffffff78,
                 (byte *)in_stack_ffffffffffffff70);
    }
  }
  return 0;
}

Assistant:

ALCenum AlsaCapture::captureSamples(al::byte *buffer, ALCuint samples)
{
    if(mRing)
    {
        mRing->read(buffer, samples);
        return ALC_NO_ERROR;
    }

    mLastAvail -= samples;
    while(mDevice->Connected.load(std::memory_order_acquire) && samples > 0)
    {
        snd_pcm_sframes_t amt{0};

        if(!mBuffer.empty())
        {
            /* First get any data stored from the last stop */
            amt = snd_pcm_bytes_to_frames(mPcmHandle, static_cast<ssize_t>(mBuffer.size()));
            if(static_cast<snd_pcm_uframes_t>(amt) > samples) amt = samples;

            amt = snd_pcm_frames_to_bytes(mPcmHandle, amt);
            std::copy_n(mBuffer.begin(), amt, buffer);

            mBuffer.erase(mBuffer.begin(), mBuffer.begin()+amt);
            amt = snd_pcm_bytes_to_frames(mPcmHandle, amt);
        }
        else if(mDoCapture)
            amt = snd_pcm_readi(mPcmHandle, buffer, samples);
        if(amt < 0)
        {
            ERR("read error: %s\n", snd_strerror(static_cast<int>(amt)));

            if(amt == -EAGAIN)
                continue;
            if((amt=snd_pcm_recover(mPcmHandle, static_cast<int>(amt), 1)) >= 0)
            {
                amt = snd_pcm_start(mPcmHandle);
                if(amt >= 0)
                    amt = snd_pcm_avail_update(mPcmHandle);
            }
            if(amt < 0)
            {
                const char *err{snd_strerror(static_cast<int>(amt))};
                ERR("restore error: %s\n", err);
                mDevice->handleDisconnect("Capture recovery failure: %s", err);
                break;
            }
            /* If the amount available is less than what's asked, we lost it
             * during recovery. So just give silence instead. */
            if(static_cast<snd_pcm_uframes_t>(amt) < samples)
                break;
            continue;
        }

        buffer = buffer + amt;
        samples -= static_cast<ALCuint>(amt);
    }
    if(samples > 0)
        std::fill_n(buffer, snd_pcm_frames_to_bytes(mPcmHandle, samples),
            al::byte((mDevice->FmtType == DevFmtUByte) ? 0x80 : 0));

    return ALC_NO_ERROR;
}